

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_shader.cpp
# Opt level: O2

void draw_line(float *line_dir,float radius,float *dot_dir,float *c)

{
  float fVar1;
  float fVar2;
  vec2 line_perp;
  float local_10;
  float local_c;
  
  local_10 = -line_dir[1];
  local_c = *line_dir;
  fVar1 = vec2_mul_inner(dot_dir,&local_10);
  if (0.0 <= fVar1) {
    fVar2 = floorf(radius / ((1.0 - *c) * 3.0 * 100.0));
    fVar2 = fmodf(fVar1,fVar2);
    if (fVar2 < 0.1) goto LAB_00109f2f;
  }
  if (fVar1 < 0.0) {
    fVar2 = floorf(radius / ((1.0 - *c) * 3.0 * 100.0));
    fVar1 = fmodf(fVar1,fVar2);
    if (-0.1 < fVar1) {
LAB_00109f2f:
      vec3_scale(c,c,0.0);
      return;
    }
  }
  c[0] = 1.0;
  c[1] = 1.0;
  c[2] = 1.0;
  return;
}

Assistant:

void draw_line(const vec2 line_dir, const float radius, const vec2 dot_dir, vec3 c){
    vec2 line_perp = {-1*line_dir[1], line_dir[0]};
    float dp = vec2_mul_inner(dot_dir, line_perp);
    if(dp >= 0 && fmod(dp, floor(radius/((1-c[0])*3*100))) < 0.1f){
        vec3_scale(c, c, 0.0f);
    }
    else if(dp < 0 && fmod(dp, floor(radius/((1-c[0])*3*100))) > -0.1f){
        vec3_scale(c, c, 0.0f);
    }
    else {
        c[0] = 1.0f;
        c[1] = 1.0f;
        c[2] = 1.0f;
    }
}